

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O0

int V_GetColor(DWORD *palette,char *str,FScriptPosition *sc)

{
  bool bVar1;
  char *cstr;
  int local_2c;
  int res;
  FString string;
  FScriptPosition *sc_local;
  char *str_local;
  DWORD *palette_local;
  
  string.Chars = (char *)sc;
  V_GetColorStringByName((char *)&stack0xffffffffffffffd8,(FScriptPosition *)str);
  bVar1 = FString::IsEmpty((FString *)&stack0xffffffffffffffd8);
  if (bVar1) {
    local_2c = V_GetColorFromString(palette,str,(FScriptPosition *)string.Chars);
  }
  else {
    cstr = FString::operator_cast_to_char_((FString *)&stack0xffffffffffffffd8);
    local_2c = V_GetColorFromString(palette,cstr,(FScriptPosition *)string.Chars);
  }
  FString::~FString((FString *)&stack0xffffffffffffffd8);
  return local_2c;
}

Assistant:

int V_GetColor (const DWORD *palette, const char *str, FScriptPosition *sc)
{
	FString string = V_GetColorStringByName (str, sc);
	int res;

	if (!string.IsEmpty())
	{
		res = V_GetColorFromString (palette, string, sc);
	}
	else
	{
		res = V_GetColorFromString (palette, str, sc);
	}
	return res;
}